

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::argument_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,Parameter *arg)

{
  char *pcVar1;
  bool bVar2;
  uint32_t uVar3;
  ExecutionModel EVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [36];
  uint32_t local_34;
  char *local_30;
  char *direction;
  SPIRType *type;
  Parameter *arg_local;
  CompilerGLSL *this_local;
  
  type = (SPIRType *)arg;
  arg_local = (Parameter *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&arg->id);
  direction = (char *)Compiler::expression_type(&this->super_Compiler,uVar3);
  local_30 = "";
  bVar2 = Compiler::is_pointer(&this->super_Compiler,(SPIRType *)direction);
  if ((bVar2) &&
     (((*(int *)(direction + 0x90) == 7 || (*(int *)(direction + 0x90) == 6)) ||
      (*(int *)(direction + 0x90) == 3)))) {
    if ((*(int *)(direction + 0x90) == 3) &&
       (EVar4 = Compiler::get_execution_model(&this->super_Compiler), EVar4 == ExecutionModelMeshEXT
       )) {
      local_34 = *(uint32_t *)(direction + 8);
      bVar2 = Compiler::has_decoration(&this->super_Compiler,(ID)local_34,Block);
      if ((bVar2) &&
         ((bVar2 = Compiler::is_builtin_type(&this->super_Compiler,(SPIRType *)direction), bVar2 &&
          (*(int *)&(type->super_IVariant).field_0xc != 0)))) {
        local_30 = "out ";
        goto LAB_004b674e;
      }
    }
    if ((*(int *)&(type->super_IVariant).field_0xc == 0) || ((type->super_IVariant).self.id == 0)) {
      if (*(int *)&(type->super_IVariant).field_0xc != 0) {
        local_30 = "out ";
      }
    }
    else {
      local_30 = "inout ";
    }
  }
LAB_004b674e:
  uVar3 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&(type->super_IVariant)._vptr_IVariant + 4));
  (*(this->super_Compiler)._vptr_Compiler[0x33])(local_58,this,(ulong)uVar3);
  pcVar1 = direction;
  uVar3 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&(type->super_IVariant)._vptr_IVariant + 4));
  (*(this->super_Compiler)._vptr_Compiler[6])(local_98,this,(ulong)uVar3,1);
  uVar3 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&(type->super_IVariant)._vptr_IVariant + 4));
  ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar3;
  (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_78,this,pcVar1,local_98);
  join<char_const*&,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)&local_30,(char **)local_58,&local_78,ts_2);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string(local_98);
  ::std::__cxx11::string::~string(local_58);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::argument_decl(const SPIRFunction::Parameter &arg)
{
	// glslangValidator seems to make all arguments pointer no matter what which is rather bizarre ...
	auto &type = expression_type(arg.id);
	const char *direction = "";

	if (is_pointer(type) &&
	    (type.storage == StorageClassFunction ||
	     type.storage == StorageClassPrivate ||
	     type.storage == StorageClassOutput))
	{
		// If we're passing around block types to function, we really mean reference in a pointer sense,
		// but DXC does not like inout for mesh blocks, so workaround that. out is technically not correct,
		// but it works in practice due to legalization. It's ... not great, but you gotta do what you gotta do.
		// GLSL will never hit this case since it's not valid.
		if (type.storage == StorageClassOutput && get_execution_model() == ExecutionModelMeshEXT &&
		    has_decoration(type.self, DecorationBlock) && is_builtin_type(type) && arg.write_count)
		{
			direction = "out ";
		}
		else if (arg.write_count && arg.read_count)
			direction = "inout ";
		else if (arg.write_count)
			direction = "out ";
	}

	return join(direction, to_qualifiers_glsl(arg.id), variable_decl(type, to_name(arg.id), arg.id));
}